

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O1

LY_ERR parse_revision(lysp_yang_ctx *ctx,lysp_revision **revs)

{
  lysp_ext_instance **exts;
  lysp_revision *plVar1;
  long lVar2;
  size_t __n;
  LY_ERR LVar3;
  long *plVar4;
  char *pcVar5;
  lysp_ext_instance **pplVar6;
  ly_stmt parent_stmt;
  ly_ctx *plVar7;
  lysp_ext_instance *plVar8;
  bool bVar9;
  ly_stmt kw;
  size_t word_len;
  char *word;
  char *buf;
  lysp_ext_instance **in_stack_ffffffffffffff90;
  ly_stmt local_64;
  size_t local_60;
  char *local_58;
  char *local_50;
  lysp_ext_instance **local_48;
  lysp_ext_instance **local_40;
  long *local_38;
  
  plVar1 = *revs;
  if (plVar1 == (lysp_revision *)0x0) {
    plVar4 = (long *)malloc(0x30);
    if (plVar4 == (long *)0x0) goto LAB_0017f9aa;
    *plVar4 = 1;
  }
  else {
    plVar8 = plVar1[-1].exts;
    plVar1[-1].exts = (lysp_ext_instance *)((long)&plVar8->name + 1);
    plVar4 = (long *)realloc(&plVar1[-1].exts,(long)plVar8 * 0x28 + 0x30);
    if (plVar4 == (long *)0x0) {
      (*revs)[-1].exts = (lysp_ext_instance *)((long)&(*revs)[-1].exts[-1].exts + 7);
LAB_0017f9aa:
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar7 = (ly_ctx *)0x0;
      }
      else {
        plVar7 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ly_log(plVar7,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_revision");
      return LY_EMEM;
    }
  }
  *revs = (lysp_revision *)(plVar4 + 1);
  lVar2 = *plVar4;
  plVar4[lVar2 * 5 + -2] = 0;
  (plVar4 + lVar2 * 5 + -2)[1] = 0;
  plVar4[lVar2 * 5 + -4] = 0;
  (plVar4 + lVar2 * 5 + -4)[1] = 0;
  plVar4[lVar2 * 5] = 0;
  LVar3 = get_argument(ctx,Y_STR_ARG,(uint16_t *)0x0,&local_58,&local_50,&local_60);
  __n = local_60;
  if (LVar3 != LY_SUCCESS) {
    return LVar3 + (LVar3 == LY_SUCCESS);
  }
  LVar3 = lysp_check_date((lysp_ctx *)ctx,local_58,local_60,"revision");
  if (LVar3 != LY_SUCCESS) {
    free(local_50);
    return LY_EVALID;
  }
  local_38 = plVar4 + lVar2 * 5 + -4;
  strncpy((char *)local_38,local_58,__n);
  free(local_50);
  LVar3 = get_keyword(ctx,&local_64,&local_58,&local_60);
  if (LVar3 != LY_SUCCESS) {
    return LVar3;
  }
  if (local_64 == LY_STMT_SYNTAX_SEMICOLON) {
    bVar9 = true;
  }
  else {
    if (local_64 != LY_STMT_SYNTAX_LEFT_BRACE) {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar7 = (ly_ctx *)0x0;
      }
      else {
        plVar7 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      pcVar5 = lyplg_ext_stmt2str(local_64);
      ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid keyword \"%s\", expected \";\" or \"{\"."
              ,pcVar5);
      return LY_EVALID;
    }
    LVar3 = get_keyword(ctx,&local_64,&local_58,&local_60);
    if (LVar3 != LY_SUCCESS) {
      return LVar3;
    }
    bVar9 = local_64 == LY_STMT_SYNTAX_RIGHT_BRACE;
  }
  if (bVar9) {
    return LY_SUCCESS;
  }
  exts = (lysp_ext_instance **)(plVar4 + lVar2 * 5);
  local_40 = exts + -1;
  local_48 = exts + -2;
  do {
    if (local_64 == LY_STMT_REFERENCE) {
      plVar8 = *local_40;
      parent_stmt = LY_STMT_REFERENCE;
      pplVar6 = local_40;
LAB_0017fb4f:
      LVar3 = parse_text_field(ctx,plVar8,parent_stmt,(uint32_t)pplVar6,(char **)0x2,Y_IDENTIF_ARG,
                               (uint16_t *)exts,in_stack_ffffffffffffff90);
    }
    else {
      if (local_64 != LY_STMT_EXTENSION_INSTANCE) {
        if (local_64 != LY_STMT_DESCRIPTION) {
          if (ctx == (lysp_yang_ctx *)0x0) {
            plVar7 = (ly_ctx *)0x0;
          }
          else {
            plVar7 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          pcVar5 = lyplg_ext_stmt2str(local_64);
          ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid keyword \"%s\" as a child of \"%s\"."
                  ,pcVar5,"revision");
          return LY_EVALID;
        }
        plVar8 = *local_48;
        parent_stmt = LY_STMT_DESCRIPTION;
        pplVar6 = local_48;
        goto LAB_0017fb4f;
      }
      LVar3 = parse_ext(ctx,local_58,local_60,local_38,LY_STMT_REVISION,0,exts);
    }
    if (LVar3 != LY_SUCCESS) {
      return LVar3;
    }
    LVar3 = get_keyword(ctx,&local_64,&local_58,&local_60);
    if (LVar3 != LY_SUCCESS) {
      return LVar3;
    }
    if (local_64 == LY_STMT_SYNTAX_RIGHT_BRACE) {
      bVar9 = true;
      if ((*exts != (lysp_ext_instance *)0x0) &&
         (LVar3 = ly_set_add(&ctx->main_ctx->ext_inst,*exts,'\x01',(uint32_t *)0x0),
         LVar3 != LY_SUCCESS)) {
        return LVar3;
      }
    }
    if (bVar9) {
      return LY_SUCCESS;
    }
  } while( true );
}

Assistant:

static LY_ERR
parse_revision(struct lysp_yang_ctx *ctx, struct lysp_revision **revs)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_revision *rev;

    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *revs, rev, LY_EMEM);

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_STR_ARG, NULL, &word, &buf, &word_len));

    /* check value */
    if (lysp_check_date((struct lysp_ctx *)ctx, word, word_len, "revision")) {
        free(buf);
        return LY_EVALID;
    }

    strncpy(rev->date, word, word_len);
    free(buf);

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, rev->dsc, LY_STMT_DESCRIPTION, 0, &rev->dsc, Y_STR_ARG, NULL, &rev->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, rev->ref, LY_STMT_REFERENCE, 0, &rev->ref, Y_STR_ARG, NULL, &rev->exts));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, rev, LY_STMT_REVISION, 0, &rev->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "revision");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, rev->exts, ret, cleanup);
    }

cleanup:
    return ret;
}